

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testKNNValidatorNoWeightingScheme(void)

{
  ulong uVar1;
  TypeUnion nnModel;
  bool bVar2;
  NearestNeighborsIndex *this;
  LinearIndex *pLVar3;
  SquaredEuclideanDistance *pSVar4;
  ostream *poVar5;
  Arena *pAVar6;
  Model m1;
  Result res;
  Model MStack_68;
  Result local_38;
  
  CoreML::Specification::Model::Model(&MStack_68,(Arena *)0x0,false);
  CoreML::KNNValidatorTests::generateInterface(&MStack_68);
  if (MStack_68._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&MStack_68);
    MStack_68._oneof_case_[0] = 0x194;
    pAVar6 = (Arena *)(MStack_68.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((MStack_68.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    MStack_68.Type_.knearestneighborsclassifier_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::KNearestNeighborsClassifier>(pAVar6);
  }
  nnModel = MStack_68.Type_;
  CoreML::KNNValidatorTests::setNumberOfNeighbors
            (MStack_68.Type_.knearestneighborsclassifier_,3,true);
  this = (nnModel.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this == (NearestNeighborsIndex *)0x0) {
    uVar1 = ((nnModel.pipelineclassifier_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    this = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NearestNeighborsIndex>
                     (pAVar6);
    (nnModel.knearestneighborsclassifier_)->nearestneighborsindex_ = this;
  }
  if (this->_oneof_case_[0] != 100) {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this);
    this->_oneof_case_[0] = 100;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pLVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LinearIndex>(pAVar6)
    ;
    (this->IndexType_).linearindex_ = pLVar3;
  }
  if (this->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this);
    this->_oneof_case_[1] = 200;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pSVar4 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SquaredEuclideanDistance>(pAVar6);
    (this->DistanceFunction_).squaredeuclideandistance_ = pSVar4;
  }
  CoreML::KNNValidatorTests::addDataPoints(nnModel.knearestneighborsclassifier_);
  CoreML::KNNValidatorTests::addStringLabels(nnModel.knearestneighborsclassifier_);
  CoreML::validate<(MLModelType)404>(&local_38,&MStack_68);
  bVar2 = CoreML::Result::good(&local_38);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x136);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&MStack_68);
  return (uint)bVar2;
}

Assistant:

int testKNNValidatorNoWeightingScheme() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_linearindex();
    nnIndex->mutable_squaredeuclideandistance();

    KNNValidatorTests::addDataPoints(knnClassifier);
    KNNValidatorTests::addStringLabels(knnClassifier);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}